

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PropertyMap.cpp
# Opt level: O0

shared_ptr<OpenMD::GenericData> __thiscall
OpenMD::PropertyMap::getPropertyByName(PropertyMap *this,string *propName)

{
  bool bVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var2;
  element_type *in_RDI;
  shared_ptr<OpenMD::GenericData> sVar3;
  iterator iter;
  element_type *this_00;
  _Self local_30;
  _Base_ptr local_28;
  _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<OpenMD::GenericData>_>_>
  local_20 [4];
  
  this_00 = in_RDI;
  std::
  _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<OpenMD::GenericData>_>_>
  ::_Rb_tree_iterator(local_20);
  local_28 = (_Base_ptr)
             std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<OpenMD::GenericData>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<OpenMD::GenericData>_>_>_>
             ::find((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<OpenMD::GenericData>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<OpenMD::GenericData>_>_>_>
                     *)in_RDI,(key_type *)0x2dd5d6);
  local_20[0]._M_node = local_28;
  local_30._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<OpenMD::GenericData>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<OpenMD::GenericData>_>_>_>
       ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<OpenMD::GenericData>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<OpenMD::GenericData>_>_>_>
              *)in_RDI);
  bVar1 = std::operator!=(local_20,&local_30);
  if (bVar1) {
    std::
    _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<OpenMD::GenericData>_>_>
    ::operator->((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<OpenMD::GenericData>_>_>
                  *)0x2dd617);
    std::shared_ptr<OpenMD::GenericData>::shared_ptr
              ((shared_ptr<OpenMD::GenericData> *)this_00,(shared_ptr<OpenMD::GenericData> *)in_RDI)
    ;
    _Var2._M_pi = extraout_RDX;
  }
  else {
    std::shared_ptr<OpenMD::GenericData>::shared_ptr
              ((shared_ptr<OpenMD::GenericData> *)this_00,in_RDI);
    _Var2._M_pi = extraout_RDX_00;
  }
  sVar3.super___shared_ptr<OpenMD::GenericData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var2._M_pi;
  sVar3.super___shared_ptr<OpenMD::GenericData,_(__gnu_cxx::_Lock_policy)2>._M_ptr = this_00;
  return (shared_ptr<OpenMD::GenericData>)
         sVar3.super___shared_ptr<OpenMD::GenericData,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<GenericData> PropertyMap::getPropertyByName(
      const std::string& propName) {
    std::map<std::string, std::shared_ptr<GenericData>>::iterator iter;

    iter = propMap_.find(propName);

    if (iter != propMap_.end())
      return iter->second;
    else
      return NULL;
  }